

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.cpp
# Opt level: O3

int __thiscall
axl::io::psx::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  socklen_t *__addr_len_00;
  undefined4 in_register_00000034;
  socklen_t addrSize;
  socklen_t local_c;
  
  local_c = 0x1c;
  __addr_len_00 = &local_c;
  if (CONCAT44(in_register_00000034,__fd) == 0) {
    __addr_len_00 = (socklen_t *)CONCAT44(in_register_00000034,__fd);
  }
  iVar1 = ::accept((this->super_File).
                   super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                   (sockaddr *)CONCAT44(in_register_00000034,__fd),__addr_len_00);
  if (iVar1 == -1) {
    err::setLastSystemError();
  }
  return iVar1;
}

Assistant:

int
Socket::accept(SockAddr* addr) {
	socklen_t addrSize = sizeof(SockAddr);
	int socket = ::accept(
		m_h,
		(sockaddr*)addr,
		addr ? &addrSize : NULL
	);

	return err::complete(socket, -1);
}